

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

string * toHexStr_abi_cxx11_(string *__return_storage_ptr__,Argument_t *arg,uint8_t bytes)

{
  undefined7 in_register_00000011;
  string sStack_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,bytes) != 0) {
    toHexStr_abi_cxx11_(&sStack_58,arg->at1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_58);
    if (bytes != '\x01') {
      toHexStr_abi_cxx11_(&local_38,arg->at2);
      std::operator+(&sStack_58," ",&local_38);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::~string((string *)&local_38);
      if (2 < bytes) {
        toHexStr_abi_cxx11_(&local_38,arg->at3);
        std::operator+(&sStack_58," ",&local_38);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&sStack_58);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toHexStr(const Instruction::Argument_t &arg, uint8_t bytes) {
    std::string s;

    if(bytes >= 1) {
        s += toHexStr(arg.at1);
    }
    if(bytes >= 2) {
        s += " " + toHexStr(arg.at2);
    }
    if(bytes >= 3) {
        s += " " + toHexStr(arg.at3);
    }

    return s;
}